

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysutil.c
# Opt level: O1

int tcp_server(char *host,unsigned_short port)

{
  undefined *puVar1;
  uint uVar2;
  int iVar3;
  in_addr_t iVar4;
  hostent *phVar5;
  ulong uVar6;
  ulong unaff_RBX;
  uint uVar7;
  undefined6 in_register_00000032;
  sockaddr *__addr;
  char *pcVar8;
  undefined1 *puVar9;
  ulong uVar10;
  int opt;
  undefined4 uStack_84;
  sockaddr sStack_80;
  char acStack_70 [24];
  ulong uStack_58;
  char *pcStack_50;
  ulong uStack_48;
  code *pcStack_40;
  sockaddr local_38;
  undefined4 local_24;
  
  uVar6 = CONCAT62(in_register_00000032,port) & 0xffffffff;
  uVar10 = 0;
  pcStack_40 = (code *)0x106e77;
  uVar2 = socket(2,1,0);
  if ((int)uVar2 < 0) {
    pcStack_40 = (code *)0x106f22;
    tcp_server_cold_3();
LAB_00106f22:
    iVar3 = (int)unaff_RBX;
    pcStack_40 = (code *)0x106f29;
    tcp_server_cold_2();
  }
  else {
    unaff_RBX = (ulong)uVar2;
    local_38.sa_data[6] = '\0';
    local_38.sa_data[7] = '\0';
    local_38.sa_data[8] = '\0';
    local_38.sa_data[9] = '\0';
    local_38.sa_data[10] = '\0';
    local_38.sa_data[0xb] = '\0';
    local_38.sa_data[0xc] = '\0';
    local_38.sa_data[0xd] = '\0';
    local_38.sa_data._0_2_ = (ushort)uVar6 << 8 | (ushort)uVar6 >> 8;
    uVar6 = CONCAT62((int6)(uVar6 >> 0x10),local_38.sa_data._0_2_);
    local_38.sa_family = 2;
    local_38.sa_data._2_4_ = 0;
    if (host == (char *)0x0) {
LAB_00106ec9:
      local_38.sa_data._2_4_ = (int)uVar10;
LAB_00106ece:
      local_24 = 1;
      pcStack_40 = (code *)0x106ef0;
      setsockopt(uVar2,1,2,&local_24,4);
      pcStack_40 = (code *)0x106eff;
      iVar3 = bind(uVar2,&local_38,0x10);
      if (iVar3 != -1) {
        pcStack_40 = (code *)0x106f10;
        listen(uVar2,0x400);
        return uVar2;
      }
      goto LAB_00106f22;
    }
    pcStack_40 = (code *)0x106eae;
    iVar3 = inet_pton(2,host,local_38.sa_data + 2);
    if (iVar3 != 0) goto LAB_00106ece;
    pcStack_40 = (code *)0x106eba;
    pcVar8 = host;
    phVar5 = gethostbyname(host);
    iVar3 = (int)pcVar8;
    if (phVar5 != (hostent *)0x0) {
      uVar10 = (ulong)*(uint *)*phVar5->h_addr_list;
      goto LAB_00106ec9;
    }
  }
  pcStack_40 = tcp_client;
  tcp_server_cold_1();
  puVar9 = (undefined1 *)0x2;
  __addr = (sockaddr *)0x1;
  uStack_58 = unaff_RBX;
  pcStack_50 = host;
  uStack_48 = uVar10;
  pcStack_40 = (code *)uVar6;
  uVar2 = socket(2,1,0);
  if (-1 < (int)uVar2) {
    if (iVar3 != 0) {
      uStack_84 = 1;
      setsockopt(uVar2,1,2,&uStack_84,4);
      acStack_70[0] = '\0';
      acStack_70[1] = '\0';
      acStack_70[2] = '\0';
      acStack_70[3] = '\0';
      acStack_70[4] = '\0';
      acStack_70[5] = '\0';
      acStack_70[6] = '\0';
      acStack_70[7] = '\0';
      acStack_70[8] = '\0';
      acStack_70[9] = '\0';
      acStack_70[10] = '\0';
      acStack_70[0xb] = '\0';
      acStack_70[0xc] = '\0';
      acStack_70[0xd] = '\0';
      acStack_70[0xe] = '\0';
      acStack_70[0xf] = '\0';
      getlocalip(acStack_70);
      __addr = &sStack_80;
      sStack_80.sa_data[6] = '\0';
      sStack_80.sa_data[7] = '\0';
      sStack_80.sa_data[8] = '\0';
      sStack_80.sa_data[9] = '\0';
      sStack_80.sa_data[10] = '\0';
      sStack_80.sa_data[0xb] = '\0';
      sStack_80.sa_data[0xc] = '\0';
      sStack_80.sa_data[0xd] = '\0';
      sStack_80.sa_data._0_2_ = (short)iVar3;
      sStack_80.sa_family = 2;
      sStack_80.sa_data._2_4_ = 0;
      iVar4 = inet_addr(acStack_70);
      sStack_80.sa_data._2_4_ = iVar4;
      puVar9 = (undefined1 *)(ulong)uVar2;
      iVar3 = bind(uVar2,__addr,0x10);
      if (iVar3 < 0) goto LAB_00106fd3;
    }
    return uVar2;
  }
  tcp_client_cold_2();
LAB_00106fd3:
  tcp_client_cold_1();
  *puVar9 = 0x3f;
  uVar7 = (uint)__addr;
  uVar2 = (uVar7 & 0xf000) - 0x1000;
  uVar6 = (ulong)uVar2;
  if ((uVar2 < 0xc000) &&
     (uVar6 = (ulong)(uVar2 >> 0xc), (0xaabU >> (uVar2 >> 0xc & 0x1f) & 1) != 0)) {
    puVar1 = &DAT_00108f14 + uVar6;
    uVar6 = (ulong)CONCAT31((uint3)(uVar2 >> 0x14),*puVar1);
    *puVar9 = *puVar1;
  }
  if ((uVar7 >> 8 & 1) != 0) {
    puVar9[1] = 0x72;
  }
  if ((char)__addr < '\0') {
    puVar9[2] = 0x77;
  }
  if (((ulong)__addr & 0x40) != 0) {
    puVar9[3] = 0x78;
  }
  if (((ulong)__addr & 0x20) != 0) {
    puVar9[4] = 0x72;
  }
  if (((ulong)__addr & 0x10) != 0) {
    puVar9[5] = 0x77;
  }
  if (((ulong)__addr & 8) != 0) {
    puVar9[6] = 0x78;
  }
  if (((ulong)__addr & 4) != 0) {
    puVar9[7] = 0x72;
  }
  if (((ulong)__addr & 2) != 0) {
    puVar9[8] = 0x77;
  }
  if (((ulong)__addr & 1) != 0) {
    puVar9[9] = 0x78;
  }
  if ((uVar7 >> 0xb & 1) != 0) {
    uVar6 = CONCAT71((int7)(uVar6 >> 8),(puVar9[3] == 'x') << 5) | 0x53;
    puVar9[3] = (char)uVar6;
  }
  if ((uVar7 >> 10 & 1) != 0) {
    uVar6 = CONCAT71((int7)(uVar6 >> 8),(puVar9[6] == 'x') << 5) | 0x53;
    puVar9[6] = (char)uVar6;
  }
  iVar3 = (int)uVar6;
  if ((uVar7 >> 9 & 1) != 0) {
    uVar6 = CONCAT71((int7)(uVar6 >> 8),(puVar9[9] == 'x') << 5) | 0x53;
    iVar3 = (int)uVar6;
    puVar9[9] = (char)uVar6;
  }
  return iVar3;
}

Assistant:

int tcp_server(const char *host, unsigned short port) {
  int sockfd = -1;
  sockfd = socket(AF_INET, SOCK_STREAM, 0);
  if (sockfd < 0) {
    ERR_EXIT("init socket");
  }

  struct sockaddr_in sa_in;
  bzero(&sa_in, sizeof(sa_in));
  sa_in.sin_family = AF_INET;
  sa_in.sin_port = htons(port);
  if (host != NULL) {
    if (inet_pton(AF_INET, host, &sa_in.sin_addr) == 0) {
      //可能为主机地址
      struct hostent *hp;
      hp = gethostbyname(host);
      if (hp == NULL) {
        ERR_EXIT("get host name");
      }
      sa_in.sin_addr = *((struct in_addr *) hp->h_addr);
    }
  } else {
    sa_in.sin_addr.s_addr = htonl(INADDR_ANY);
  }

  int opt = 1;
  setsockopt(sockfd, SOL_SOCKET, SO_REUSEADDR, &opt, sizeof(opt));

  if (bind(sockfd, (struct sockaddr *) &sa_in, sizeof(sa_in)) == -1) {
    close(sockfd);
    ERR_EXIT("bind sockfd wit addr");
  }

  listen(sockfd, LISTENQ);

  return sockfd;
}